

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<wchar_t>::parse_unit(NFA<wchar_t> *this,Stream *stream,wchar_t ch)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  StreamException *__return_storage_ptr__;
  CharClass<wchar_t> local_40;
  
  if (ch == L'(') {
    NFA((NFA<wchar_t> *)&local_40,stream);
    concat(this,(NFA<wchar_t> *)&local_40);
    NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::~NFABase
              ((NFABase<Centaurus::NFABaseState<wchar_t,_int>_> *)&local_40);
  }
  else {
    if (ch == L'.') {
      CharClass<wchar_t>::make_star();
      add_state(this,&local_40);
    }
    else if (ch == L'[') {
      CharClass<wchar_t>::CharClass(&local_40,stream);
      add_state(this,&local_40);
    }
    else if (ch == L'\\') {
      wVar2 = Stream::get(stream);
      if (((0x35 < (uint)(wVar2 + L'\xffffffd8')) ||
          ((0x3800000080004fU >> ((ulong)(uint)(wVar2 + L'\xffffffd8') & 0x3f) & 1) == 0)) &&
         (2 < (uint)(wVar2 + L'\xffffff85'))) {
        __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(__return_storage_ptr__,stream,wVar2);
        __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                    StreamException::~StreamException);
      }
      CharClass<wchar_t>::CharClass(&local_40,wVar2);
      add_state(this,&local_40);
    }
    else {
      CharClass<wchar_t>::CharClass(&local_40,ch);
      add_state(this,&local_40);
    }
    CharClass<wchar_t>::~CharClass(&local_40);
  }
  pwVar1 = (stream->m_cur)._M_current;
  if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
    return;
  }
  wVar2 = *pwVar1;
  if (wVar2 != L'*') {
    if (wVar2 == L'?') {
      Stream::get(stream);
      pwVar1 = (stream->m_cur)._M_current;
      if (pwVar1 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
        wVar2 = *pwVar1;
        if (wVar2 == L'*') {
          Stream::get(stream);
          local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
          local_40.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_40.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_40.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          add_transition_from(this,&local_40,1);
          goto LAB_0011b03d;
        }
        if (wVar2 == L'?') {
          Stream::get(stream);
          local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
          local_40.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_40.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_40.m_ranges.
          super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          add_transition_from(this,&local_40,1);
          goto LAB_0011b03d;
        }
      }
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_transition_from(this,&local_40,1);
      goto LAB_0011b03d;
    }
    if (wVar2 != L'+') {
      return;
    }
    Stream::get(stream);
    pwVar1 = (stream->m_cur)._M_current;
    if (pwVar1 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
      wVar2 = *pwVar1;
      if (wVar2 == L'*') {
        Stream::get(stream);
        local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        add_transition_to(this,&local_40,1,false);
        goto LAB_0011b03d;
      }
      if (wVar2 == L'?') {
        Stream::get(stream);
        local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        add_transition_to(this,&local_40,1,false);
        goto LAB_0011b03d;
      }
      if (wVar2 == L'+') {
        Stream::get(stream);
        local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_40.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        add_transition_to(this,&local_40,1,true);
        goto LAB_0011b03d;
      }
    }
    local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
    local_40.m_ranges.
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40.m_ranges.
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40.m_ranges.
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    add_transition_to(this,&local_40,1,false);
    goto LAB_0011b03d;
  }
  Stream::get(stream);
  pwVar1 = (stream->m_cur)._M_current;
  if (pwVar1 != (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
    wVar2 = *pwVar1;
    if (wVar2 == L'*') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_transition_to(this,&local_40,1,false);
      CharClass<wchar_t>::~CharClass(&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_state(this,&local_40);
      CharClass<wchar_t>::~CharClass(&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_transition_from(this,&local_40,1);
      goto LAB_0011b03d;
    }
    if (wVar2 == L'?') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_transition_to(this,&local_40,1,false);
      CharClass<wchar_t>::~CharClass(&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_state(this,&local_40);
      CharClass<wchar_t>::~CharClass(&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_transition_from(this,&local_40,1);
      goto LAB_0011b03d;
    }
    if (wVar2 == L'+') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_transition_to(this,&local_40,1,true);
      CharClass<wchar_t>::~CharClass(&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_state(this,&local_40);
      CharClass<wchar_t>::~CharClass(&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      add_transition_from(this,&local_40,1);
      goto LAB_0011b03d;
    }
  }
  local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  add_transition_to(this,&local_40,1,false);
  CharClass<wchar_t>::~CharClass(&local_40);
  local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  add_state(this,&local_40);
  CharClass<wchar_t>::~CharClass(&local_40);
  local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_00197288;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  add_transition_from(this,&local_40,1);
LAB_0011b03d:
  CharClass<wchar_t>::~CharClass(&local_40);
  return;
}

Assistant:

void parse_unit(Stream& stream, wchar_t ch)
    {
        switch (ch)
        {
        case L'\\':
            ch = stream.get();
            switch (ch)
            {
            case L'[':
            case L']':
            case L'+':
            case L'*':
            case L'{':
            case L'}':
            case L'?':
            case L'\\':
            case L'|':
            case L'(':
            case L')':
            case L'.':
                add_state(CharClass<TCHAR>(ch));
                break;
            default:
                throw stream.unexpected(ch);
            }
            break;
        case L'[':
            add_state(CharClass<TCHAR>(stream));
            break;
        case L'.':
            add_state(CharClass<TCHAR>::make_star());
            break;
        case L'(':
            concat(NFA<TCHAR>(stream));
            break;
        default:
            add_state(CharClass<TCHAR>(ch));
            break;
        }
        ch = stream.peek();
        switch (ch)
        {
        case L'+':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'+':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1, true);
                break;
            case L'?':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        case L'*':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'+':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1, true);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'?':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        case L'?':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'?':
                stream.discard();
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        }
    }